

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecSet.h
# Opt level: O3

int Vec_SetAppend(Vec_Set_t *p,int *pArray,int nSize)

{
  word **__ptr;
  word *pwVar1;
  word wVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  
  iVar5 = nSize + 1 >> 1;
  iVar4 = 1 << ((byte)p->nPageSize & 0x1f);
  if (iVar4 <= iVar5) {
    __assert_fail("nWords < (1 << p->nPageSize)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecSet.h"
                  ,0xd8,"int Vec_SetAppend(Vec_Set_t *, int *, int)");
  }
  p->nEntries = p->nEntries + 1;
  __ptr = p->pPages;
  iVar6 = p->iPage;
  pwVar1 = __ptr[iVar6];
  iVar3 = (int)*pwVar1;
  if (iVar4 <= iVar3 + iVar5) {
    uVar7 = (long)iVar6 + 1;
    p->iPage = (int)uVar7;
    if ((int)uVar7 == p->nPagesAlloc) {
      __ptr = (word **)realloc(__ptr,uVar7 * 0x10);
      p->pPages = __ptr;
      iVar4 = p->nPagesAlloc;
      memset(__ptr + iVar4,0,(long)iVar4 << 3);
      p->nPagesAlloc = iVar4 * 2;
      uVar7 = (ulong)(uint)p->iPage;
    }
    iVar6 = (int)uVar7;
    pwVar1 = __ptr[iVar6];
    if (pwVar1 == (word *)0x0) {
      pwVar1 = (word *)malloc((long)(1 << ((byte)p->nPageSize & 0x1f)) << 3);
      __ptr[iVar6] = pwVar1;
      __ptr = p->pPages;
      pwVar1 = __ptr[iVar6];
    }
    *pwVar1 = 2;
    pwVar1[1] = 0xffffffffffffffff;
    iVar3 = 2;
  }
  if (pArray != (int *)0x0) {
    memcpy(pwVar1 + iVar3,pArray,(long)nSize << 2);
    __ptr = p->pPages;
    iVar6 = p->iPage;
  }
  wVar2 = (long)iVar5 + *__ptr[iVar6];
  *__ptr[iVar6] = wVar2;
  return ((int)wVar2 - iVar5) + (iVar6 << ((byte)p->nPageSize & 0x1f));
}

Assistant:

static inline int Vec_SetAppend( Vec_Set_t * p, int * pArray, int nSize )
{
    int nWords = Vec_SetWordNum( nSize );
    assert( nWords < (1 << p->nPageSize) );
    p->nEntries++;
    if ( Vec_SetLimit( p->pPages[p->iPage] ) + nWords >= (1 << p->nPageSize) )
    {
        if ( ++p->iPage == p->nPagesAlloc )
        {
            p->pPages = ABC_REALLOC( word *, p->pPages, p->nPagesAlloc * 2 );
            memset( p->pPages + p->nPagesAlloc, 0, sizeof(word *) * p->nPagesAlloc );
            p->nPagesAlloc *= 2;
        }
        if ( p->pPages[p->iPage] == NULL )
            p->pPages[p->iPage] = ABC_ALLOC( word, (1 << p->nPageSize) );
        Vec_SetWriteLimit( p->pPages[p->iPage], 2 );
        p->pPages[p->iPage][1] = ~0;
    }
    if ( pArray )
        memcpy( p->pPages[p->iPage] + Vec_SetLimit(p->pPages[p->iPage]), pArray, sizeof(int) * nSize );
    Vec_SetIncLimit( p->pPages[p->iPage], nWords );
    return Vec_SetHandCurrent(p) - nWords;
}